

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zesPowerSetLimits
          (zes_pwr_handle_t hPower,zes_power_sustained_limit_t *pSustained,
          zes_power_burst_limit_t *pBurst,zes_power_peak_limit_t *pPeak)

{
  zes_pfnPowerSetLimits_t pfnSetLimits;
  ze_result_t result;
  zes_power_peak_limit_t *pPeak_local;
  zes_power_burst_limit_t *pBurst_local;
  zes_power_sustained_limit_t *pSustained_local;
  zes_pwr_handle_t hPower_local;
  
  pfnSetLimits._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011cbe8 != (code *)0x0) {
    pfnSetLimits._4_4_ = (*DAT_0011cbe8)(hPower,pSustained,pBurst,pPeak);
  }
  return pfnSetLimits._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesPowerSetLimits(
        zes_pwr_handle_t hPower,                        ///< [in] Handle for the component.
        const zes_power_sustained_limit_t* pSustained,  ///< [in][optional] The sustained power limit. If this is null, no changes
                                                        ///< will be made to the sustained power limits.
        const zes_power_burst_limit_t* pBurst,          ///< [in][optional] The burst power limit. If this is null, no changes will
                                                        ///< be made to the burst power limits.
        const zes_power_peak_limit_t* pPeak             ///< [in][optional] The peak power limit. If this is null, no changes will
                                                        ///< be made to the peak power limits.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnSetLimits = context.zesDdiTable.Power.pfnSetLimits;
        if( nullptr != pfnSetLimits )
        {
            result = pfnSetLimits( hPower, pSustained, pBurst, pPeak );
        }
        else
        {
            // generic implementation
        }

        return result;
    }